

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

int Wlc_PrsRemoveComments(Wlc_Prs_t *p)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  byte *pbVar6;
  Vec_Str_t *pVVar7;
  char *pcVar8;
  byte *__s1;
  byte *pbVar9;
  byte *pbVar10;
  
  __s1 = (byte *)p->pBuffer;
  pbVar1 = __s1 + p->nFileSize;
  pbVar9 = __s1 + (long)p->nFileSize + -10;
  bVar2 = false;
LAB_0031059b:
  if (pbVar1 <= __s1) {
    return 1;
  }
  bVar3 = *__s1;
  if (bVar3 != 0x73) {
    if (bVar3 == 0x60) {
      pbVar6 = (byte *)Wlc_PrsFindSymbol((char *)__s1,'\n');
      if (pbVar6 == (byte *)0x0) {
        pcVar8 = "Cannot find end-of-line after symbols \"`\".";
        goto LAB_0031080c;
      }
      for (; __s1 < pbVar6; __s1 = __s1 + 1) {
        *__s1 = 0x20;
      }
      goto LAB_003107ac;
    }
    if (bVar3 == 0x65) {
      if (__s1[1] != 0x6e) goto LAB_003107be;
      if ((__s1[2] == 100) && (iVar5 = strncmp((char *)__s1,"endmodule",9), iVar5 == 0)) {
        __s1[9] = 0x3b;
      }
      goto LAB_003107ac;
    }
    if (bVar3 == 0x2f) {
      if (__s1[1] == 0x2a) {
        pcVar8 = Wlc_PrsFindSymbolTwo((char *)__s1,'*','/');
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "Cannot find symbols \"*/\" after symbols \"/*\".";
LAB_0031080c:
          Wlc_PrsWriteErrorMessage(p,(char *)__s1,pcVar8);
          return 0;
        }
        for (; __s1 < pcVar8 + 2; __s1 = __s1 + 1) {
          *__s1 = 0x20;
        }
      }
      else if (__s1[1] == 0x2f) {
        if (((__s1 + 5 < pbVar1) && (__s1[2] == 0x61)) &&
           ((__s1[3] == 0x62 && ((__s1[4] == 99 && (__s1[5] == 0x32)))))) {
          __s1[4] = 0x20;
          __s1[5] = 0x20;
          __s1[0] = 0x20;
          __s1[1] = 0x20;
          __s1[2] = 0x20;
          __s1[3] = 0x20;
          goto LAB_003107be;
        }
        iVar5 = strncmp((char *)(__s1 + 3),"Pair:",5);
        if (iVar5 == 0) {
          if (p->vPoPairs == (Vec_Str_t *)0x0) {
            pVVar7 = Vec_StrAlloc(100);
            p->vPoPairs = pVVar7;
          }
          pbVar6 = __s1 + 9;
          do {
            bVar3 = *pbVar6;
            if (bVar3 != 0xd) {
              if (bVar3 == 0x20) {
                bVar3 = 0;
              }
              else if (bVar3 == 10) goto LAB_0031078d;
              Vec_StrPush(p->vPoPairs,bVar3);
            }
            pbVar6 = pbVar6 + 1;
          } while( true );
        }
        pbVar6 = (byte *)Wlc_PrsFindSymbol((char *)__s1,'\n');
        if (pbVar6 == (byte *)0x0) {
          pcVar8 = "Cannot find end-of-line after symbols \"//\".";
          goto LAB_0031080c;
        }
        for (; __s1 < pbVar6; __s1 = __s1 + 1) {
          *__s1 = 0x20;
        }
      }
      goto LAB_003107ac;
    }
    goto LAB_003107ae;
  }
  if (__s1[1] == 0x70) {
    if ((__s1[2] == 0x65) && (iVar5 = strncmp((char *)__s1,"specify",7), pbVar6 = __s1, iVar5 == 0))
    {
LAB_003106ab:
      if (pbVar6 < pbVar9) {
        if (((*pbVar6 != 0x65) || (pbVar6[1] != 0x6e)) || (pbVar6[2] != 100)) goto LAB_003106e3;
        pcVar8 = "endspecify";
        pbVar10 = pbVar6;
        iVar5 = strncmp((char *)pbVar6,"endspecify",10);
        if (iVar5 != 0) goto LAB_003106e3;
        for (; __s1 < pbVar6 + 10; __s1 = __s1 + 1) {
          *__s1 = 0x20;
        }
        if (!bVar2) {
          Abc_Print((int)pbVar10,pcVar8);
        }
        bVar2 = true;
      }
    }
    goto LAB_003107ac;
  }
  goto LAB_003107be;
LAB_003106e3:
  pbVar6 = pbVar6 + 1;
  goto LAB_003106ab;
LAB_0031078d:
  cVar4 = Vec_StrEntryLast(p->vPoPairs);
  if (cVar4 != '\0') {
    Vec_StrPush(p->vPoPairs,'\0');
  }
LAB_003107ac:
  bVar3 = *__s1;
LAB_003107ae:
  if ((bVar3 < 0xe) && ((0x2600U >> (bVar3 & 0x1f) & 1) != 0)) {
    *__s1 = 0x20;
  }
LAB_003107be:
  __s1 = __s1 + 1;
  goto LAB_0031059b;
}

Assistant:

int Wlc_PrsRemoveComments( Wlc_Prs_t * p )
{
    int fSpecifyFound = 0;
    char * pCur, * pNext, * pEnd = p->pBuffer + p->nFileSize;
    for ( pCur = p->pBuffer; pCur < pEnd; pCur++ )
    {
        // regular comment (//)
        if ( *pCur == '/' && pCur[1] == '/' )
        {
            if ( pCur + 5 < pEnd && pCur[2] == 'a' && pCur[3] == 'b' && pCur[4] == 'c' && pCur[5] == '2' )
                pCur[0] = pCur[1] = pCur[2] = pCur[3] = pCur[4] = pCur[5] = ' ';
            else if ( !strncmp(pCur + 3, "Pair:", 5) )
            {
                if ( p->vPoPairs == NULL )
                    p->vPoPairs = Vec_StrAlloc( 100 );
                for ( pNext = pCur + 9; *pNext != '\n'; pNext++ )
                {
                    if ( *pNext == ' ' )
                        Vec_StrPush( p->vPoPairs, '\0' );
                    else if ( *pNext != '\r' )
                        Vec_StrPush( p->vPoPairs, *pNext );
                }
                if ( Vec_StrEntryLast(p->vPoPairs) != 0 )
                    Vec_StrPush(p->vPoPairs, 0);
            }
            else
            {
                pNext = Wlc_PrsFindSymbol( pCur, '\n' );
                if ( pNext == NULL )
                    return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find end-of-line after symbols \"//\"." );
                for ( ; pCur < pNext; pCur++ )
                    *pCur = ' ';
            }
        }
        // skip preprocessor directive (`timescale, `celldefine, etc)
        else if ( *pCur == '`' )
        {
            pNext = Wlc_PrsFindSymbol( pCur, '\n' );
            if ( pNext == NULL )
                return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find end-of-line after symbols \"`\"." );
            for ( ; pCur < pNext; pCur++ )
                *pCur = ' ';
        }
        // regular comment (/* ... */)
        else if ( *pCur == '/' && pCur[1] == '*' )
        {
            pNext = Wlc_PrsFindSymbolTwo( pCur, '*', '/' );
            if ( pNext == NULL )
                return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find symbols \"*/\" after symbols \"/*\"." );
            // overwrite comment
            for ( ; pCur < pNext + 2; pCur++ )
                *pCur = ' ';
        }
        // 'specify' treated as comments
        else if ( *pCur == 's' && pCur[1] == 'p' && pCur[2] == 'e' && !strncmp(pCur, "specify", 7) )
        {
            for ( pNext = pCur; pNext < pEnd - 10; pNext++ )
                if ( *pNext == 'e' && pNext[1] == 'n' && pNext[2] == 'd' && !strncmp(pNext, "endspecify", 10) )
                {
                    // overwrite comment
                    for ( ; pCur < pNext + 10; pCur++ )
                        *pCur = ' ';
                    if ( fSpecifyFound == 0 )
                        Abc_Print( 0, "Ignoring specify/endspecify directives.\n" );
                    fSpecifyFound = 1;
                    break;
                }
        }
        // insert semicolons
        else if ( *pCur == 'e' && pCur[1] == 'n' && pCur[2] == 'd' && !strncmp(pCur, "endmodule", 9) )
            pCur[strlen("endmodule")] = ';';
        // overwrite end-of-lines with spaces (less checking to do later on)
        if ( *pCur == '\n' || *pCur == '\r'  || *pCur == '\t' )
            *pCur = ' ';
    }
    return 1;
}